

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

int libwebvtt::Parser::ParseSettings(string *line,size_type idx,settings_t *settings)

{
  char cVar1;
  list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_> *this;
  settings_t *psVar2;
  settings_t *psVar3;
  char *pcVar4;
  reference pvVar5;
  ulong uVar6;
  char c_2;
  char c_1;
  Setting *s;
  Setting local_78;
  char local_29;
  settings_t *psStack_28;
  char c;
  settings_t *settings_local;
  size_type idx_local;
  string *line_local;
  
  psStack_28 = settings;
  settings_local = (settings_t *)idx;
  idx_local = (size_type)line;
  std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::clear(settings);
  psVar2 = settings_local;
  if ((settings_local != (settings_t *)0xffffffffffffffff) &&
     (psVar3 = (settings_t *)std::__cxx11::string::length(), psVar2 < psVar3)) {
    do {
      while( true ) {
        pcVar4 = (char *)std::__cxx11::string::operator[](idx_local);
        this = psStack_28;
        local_29 = *pcVar4;
        if (local_29 == '\0') {
          return 0;
        }
        if ((local_29 != ' ') && (local_29 != '\t')) break;
        settings_local = settings_local + 1;
      }
      local_78.value.field_2._M_allocated_capacity = 0;
      local_78.value.field_2._8_8_ = 0;
      local_78.value._M_dataplus = (_Alloc_hider)0x0;
      local_78.value._1_7_ = 0;
      local_78.value._M_string_length = 0;
      local_78.name.field_2._M_allocated_capacity = 0;
      local_78.name.field_2._8_8_ = 0;
      local_78.name._M_dataplus = (_Alloc_hider)0x0;
      local_78.name._1_7_ = 0;
      local_78.name._M_string_length = 0;
      Setting::Setting(&local_78);
      std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::push_back
                (this,&local_78);
      Setting::~Setting(&local_78);
      pvVar5 = std::__cxx11::list<libwebvtt::Setting,_std::allocator<libwebvtt::Setting>_>::back
                         (psStack_28);
      while( true ) {
        pcVar4 = (char *)std::__cxx11::string::operator[](idx_local);
        cVar1 = *pcVar4;
        if (cVar1 == ':') break;
        if (((cVar1 == '\0') || (cVar1 == ' ')) || (cVar1 == '\t')) {
          return -1;
        }
        std::__cxx11::string::push_back((char)pvVar5);
        settings_local = settings_local + 1;
      }
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        return -1;
      }
      while( true ) {
        settings_local = settings_local + 1;
        pcVar4 = (char *)std::__cxx11::string::operator[](idx_local);
        cVar1 = *pcVar4;
        if (((cVar1 == '\0') || (cVar1 == ' ')) || (cVar1 == '\t')) break;
        if (cVar1 == ':') {
          return -1;
        }
        std::__cxx11::string::push_back((char)pvVar5 + ' ');
      }
      uVar6 = std::__cxx11::string::empty();
    } while ((uVar6 & 1) == 0);
  }
  return -1;
}

Assistant:

int Parser::ParseSettings(const std::string& line, std::string::size_type idx,
                          Cue::settings_t* settings) {
  settings->clear();

  if (idx == std::string::npos || idx >= line.length())
    return -1;

  for (;;) {
    // We must parse a line comprising a sequence of 0 or more
    // NAME:VALUE pairs, separated by whitespace.  The line iself is
    // terminated with a NUL char (indicating end-of-line).

    for (;;) {
      const char c = line[idx];

      if (c == kNUL)  // end-of-line
        return 0;  // success

      if (c != kSPACE && c != kTAB)
        break;

      ++idx;  // consume whitespace
    }

    // We have consumed the whitespace, and have not yet reached
    // end-of-line, so there is something on the line for us to parse.

    settings->push_back(Setting());
    Setting& s = settings->back();

    // Parse the NAME part of the settings pair.

    for (;;) {
      const char c = line[idx];

      if (c == ':')  // we have reached end of NAME part
        break;

      if (c == kNUL || c == kSPACE || c == kTAB)
        return -1;

      s.name.push_back(c);

      ++idx;
    }

    if (s.name.empty())
      return -1;

    ++idx;  // consume colon

    // Parse the VALUE part of the settings pair.

    for (;;) {
      const char c = line[idx];

      if (c == kNUL || c == kSPACE || c == kTAB)
        break;

      if (c == ':')  // suspicious when part of VALUE
        return -1;  // TODO(matthewjheaney): verify this behavior

      s.value.push_back(c);

      ++idx;
    }

    if (s.value.empty())
      return -1;
  }
}